

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetFloatVerifier::verifyIntegerAnyOf
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,GLint *references,
          size_t referencesLength)

{
  int *piVar1;
  ostringstream *this_00;
  bool bVar2;
  size_t ndx;
  size_t sVar3;
  StateQueryMemoryWriteGuard<float> state;
  MessageBuilder local_1b0;
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float>::StateQueryMemoryWriteGuard(&state);
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&state.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float>::verifyValidity
                    (&state,testCtx);
  if (bVar2) {
    sVar3 = 0;
    do {
      if (referencesLength == sVar3) {
        local_1b0.m_log = testCtx->m_log;
        this_00 = &local_1b0.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,"// ERROR: got ");
        std::ostream::operator<<(this_00,state.m_value);
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        if (testCtx->m_testResult != QP_TEST_RESULT_PASS) {
          return;
        }
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
        return;
      }
      piVar1 = references + sVar3;
      sVar3 = sVar3 + 1;
    } while ((state.m_value != (float)*piVar1) || (NAN(state.m_value) || NAN((float)*piVar1)));
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyIntegerAnyOf (tcu::TestContext& testCtx, GLenum name, const GLint references[], size_t referencesLength)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat> state;
	glGetFloatv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	for (size_t ndx = 0; ndx < referencesLength; ++ndx)
	{
		const GLfloat expectedGLState = GLfloat(references[ndx]);
		DE_ASSERT(references[ndx] == GLint(expectedGLState)); // reference integer must have 1:1 mapping to float for this to work. Reference value is always such value in these tests

		if (state == expectedGLState)
			return;
	}

	testCtx.getLog() << TestLog::Message << "// ERROR: got " << state << TestLog::EndMessage;
	if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
}